

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefile.cxx
# Opt level: O0

MessageType __thiscall
cmMakefile::ExpandVariablesInStringOld
          (cmMakefile *this,string *errorstr,string *source,bool escapeQuotes,bool noEscapes,
          bool atOnly,char *filename,long line,bool removeEmpty,bool replaceAt)

{
  bool bVar1;
  int iVar2;
  PolicyStatus PVar3;
  long lVar4;
  size_type sVar5;
  size_type sVar6;
  string *psVar7;
  char *pcVar8;
  ostream *poVar9;
  PolicyID id;
  PolicyID id_00;
  string_view str;
  string local_370 [32];
  string local_350;
  string local_330;
  undefined1 local_310 [8];
  ostringstream error;
  MessageType local_194;
  MessageType mtype;
  char *emsg;
  undefined1 local_180 [4];
  int res;
  cmCommandArgumentParserHelper parser;
  string local_c8;
  cmValue local_a8;
  cmValue val;
  undefined1 local_98 [8];
  string var;
  char *last;
  char *first;
  char *local_58;
  char *in;
  string input;
  bool replaceAt_local;
  bool removeEmpty_local;
  bool atOnly_local;
  bool noEscapes_local;
  bool escapeQuotes_local;
  string *source_local;
  string *errorstr_local;
  cmMakefile *this_local;
  
  input.field_2._M_local_buf[0xc] = removeEmpty;
  input.field_2._M_local_buf[0xb] = replaceAt;
  input.field_2._M_local_buf[0xd] = atOnly;
  input.field_2._M_local_buf[0xe] = noEscapes;
  input.field_2._M_local_buf[0xf] = escapeQuotes;
  lVar4 = std::__cxx11::string::find_first_of((char *)source,0xd2e0e6);
  if (lVar4 == -1) {
    this_local._4_4_ = LOG;
  }
  else if ((input.field_2._M_local_buf[0xd] & 1U) == 0) {
    cmCommandArgumentParserHelper::cmCommandArgumentParserHelper
              ((cmCommandArgumentParserHelper *)local_180);
    cmCommandArgumentParserHelper::SetMakefile((cmCommandArgumentParserHelper *)local_180,this);
    cmCommandArgumentParserHelper::SetLineFile
              ((cmCommandArgumentParserHelper *)local_180,line,filename);
    cmCommandArgumentParserHelper::SetEscapeQuotes
              ((cmCommandArgumentParserHelper *)local_180,
               (bool)(input.field_2._M_local_buf[0xf] & 1));
    cmCommandArgumentParserHelper::SetNoEscapeMode
              ((cmCommandArgumentParserHelper *)local_180,
               (bool)(input.field_2._M_local_buf[0xe] & 1));
    cmCommandArgumentParserHelper::SetReplaceAtSyntax
              ((cmCommandArgumentParserHelper *)local_180,
               (bool)(input.field_2._M_local_buf[0xb] & 1));
    cmCommandArgumentParserHelper::SetRemoveEmpty
              ((cmCommandArgumentParserHelper *)local_180,
               (bool)(input.field_2._M_local_buf[0xc] & 1));
    iVar2 = cmCommandArgumentParserHelper::ParseString
                      ((cmCommandArgumentParserHelper *)local_180,source,0);
    pcVar8 = cmCommandArgumentParserHelper::GetError((cmCommandArgumentParserHelper *)local_180);
    local_194 = LOG;
    if ((iVar2 == 0) || (*pcVar8 != '\0')) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_310);
      std::operator<<((ostream *)local_310,"Syntax error in cmake code ");
      if ((filename != (char *)0x0) && (0 < line)) {
        poVar9 = std::operator<<((ostream *)local_310,"at\n");
        poVar9 = std::operator<<(poVar9,"  ");
        poVar9 = std::operator<<(poVar9,filename);
        poVar9 = std::operator<<(poVar9,":");
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,line);
        std::operator<<(poVar9,"\n");
      }
      poVar9 = std::operator<<((ostream *)local_310,"when parsing string\n");
      poVar9 = std::operator<<(poVar9,"  ");
      poVar9 = std::operator<<(poVar9,(string *)source);
      std::operator<<(poVar9,"\n");
      std::operator<<((ostream *)local_310,pcVar8);
      local_194 = FATAL_ERROR;
      if (iVar2 == 0) {
        PVar3 = GetPolicyStatus(this,CMP0010,false);
        switch(PVar3) {
        case WARN:
          poVar9 = std::operator<<((ostream *)local_310,"\n");
          cmPolicies::GetPolicyWarning_abi_cxx11_(&local_330,(cmPolicies *)0xa,id);
          std::operator<<(poVar9,(string *)&local_330);
          std::__cxx11::string::~string((string *)&local_330);
        case OLD:
          local_194 = AUTHOR_WARNING;
          break;
        case NEW:
          break;
        case REQUIRED_IF_USED:
        case REQUIRED_ALWAYS:
          poVar9 = std::operator<<((ostream *)local_310,"\n");
          cmPolicies::GetRequiredPolicyError_abi_cxx11_(&local_350,(cmPolicies *)0xa,id_00);
          std::operator<<(poVar9,(string *)&local_350);
          std::__cxx11::string::~string((string *)&local_350);
        }
      }
      std::__cxx11::ostringstream::str();
      std::__cxx11::string::operator=((string *)errorstr,local_370);
      std::__cxx11::string::~string(local_370);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_310);
    }
    else {
      psVar7 = cmCommandArgumentParserHelper::GetResult_abi_cxx11_
                         ((cmCommandArgumentParserHelper *)local_180);
      std::__cxx11::string::operator=((string *)source,(string *)psVar7);
    }
    this_local._4_4_ = local_194;
    cmCommandArgumentParserHelper::~cmCommandArgumentParserHelper
              ((cmCommandArgumentParserHelper *)local_180);
  }
  else {
    std::__cxx11::string::string((string *)&in,(string *)source);
    std::__cxx11::string::clear();
    local_58 = (char *)std::__cxx11::string::c_str();
    while (bVar1 = cmsys::RegularExpression::find(&this->cmAtVarRegex,local_58), bVar1) {
      sVar5 = cmsys::RegularExpression::start(&this->cmAtVarRegex);
      sVar6 = cmsys::RegularExpression::end(&this->cmAtVarRegex);
      var.field_2._8_8_ = local_58 + sVar6;
      std::__cxx11::string::append((char *)source,(ulong)local_58);
      lVar4 = var.field_2._8_8_ - (long)(local_58 + sVar5);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)local_98,local_58 + sVar5 + 1,lVar4 - 2,
                 (allocator *)((long)&val.Value + 7));
      std::allocator<char>::~allocator((allocator<char> *)((long)&val.Value + 7));
      local_a8 = GetDefinition(this,(string *)local_98);
      bVar1 = cmValue::operator_cast_to_bool(&local_a8);
      if (bVar1) {
        if ((input.field_2._M_local_buf[0xf] & 1U) == 0) {
          cmValue::operator*[abi_cxx11_(&local_a8);
          std::__cxx11::string::append((string *)source);
        }
        else {
          psVar7 = cmValue::operator*[abi_cxx11_(&local_a8);
          str = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar7);
          parser._160_8_ = str._M_len;
          cmEscapeQuotes_abi_cxx11_(&local_c8,str);
          std::__cxx11::string::append((string *)source);
          std::__cxx11::string::~string((string *)&local_c8);
        }
      }
      local_58 = (char *)var.field_2._8_8_;
      std::__cxx11::string::~string((string *)local_98);
    }
    std::__cxx11::string::append((char *)source);
    this_local._4_4_ = LOG;
    std::__cxx11::string::~string((string *)&in);
  }
  return this_local._4_4_;
}

Assistant:

MessageType cmMakefile::ExpandVariablesInStringOld(
  std::string& errorstr, std::string& source, bool escapeQuotes,
  bool noEscapes, bool atOnly, const char* filename, long line,
  bool removeEmpty, bool replaceAt) const
{
  // Fast path strings without any special characters.
  if (source.find_first_of("$@\\") == std::string::npos) {
    return MessageType::LOG;
  }

  // Special-case the @ONLY mode.
  if (atOnly) {
    // Store an original copy of the input.
    std::string input = source;

    // Start with empty output.
    source.clear();

    // Look for one @VAR@ at a time.
    const char* in = input.c_str();
    while (this->cmAtVarRegex.find(in)) {
      // Get the range of the string to replace.
      const char* first = in + this->cmAtVarRegex.start();
      const char* last = in + this->cmAtVarRegex.end();

      // Store the unchanged part of the string now.
      source.append(in, first - in);

      // Lookup the definition of VAR.
      std::string var(first + 1, last - first - 2);
      if (cmValue val = this->GetDefinition(var)) {
        // Store the value in the output escaping as requested.
        if (escapeQuotes) {
          source.append(cmEscapeQuotes(*val));
        } else {
          source.append(*val);
        }
      }

      // Continue looking for @VAR@ further along the string.
      in = last;
    }

    // Append the rest of the unchanged part of the string.
    source.append(in);

    return MessageType::LOG;
  }

  // This method replaces ${VAR} and @VAR@ where VAR is looked up
  // with GetDefinition(), if not found in the map, nothing is expanded.
  // It also supports the $ENV{VAR} syntax where VAR is looked up in
  // the current environment variables.

  cmCommandArgumentParserHelper parser;
  parser.SetMakefile(this);
  parser.SetLineFile(line, filename);
  parser.SetEscapeQuotes(escapeQuotes);
  parser.SetNoEscapeMode(noEscapes);
  parser.SetReplaceAtSyntax(replaceAt);
  parser.SetRemoveEmpty(removeEmpty);
  int res = parser.ParseString(source, 0);
  const char* emsg = parser.GetError();
  MessageType mtype = MessageType::LOG;
  if (res && !emsg[0]) {
    source = parser.GetResult();
  } else {
    // Construct the main error message.
    std::ostringstream error;
    error << "Syntax error in cmake code ";
    if (filename && line > 0) {
      // This filename and line number may be more specific than the
      // command context because one command invocation can have
      // arguments on multiple lines.
      error << "at\n"
            << "  " << filename << ":" << line << "\n";
    }
    error << "when parsing string\n"
          << "  " << source << "\n";
    error << emsg;

    // If the parser failed ("res" is false) then this is a real
    // argument parsing error, so the policy applies.  Otherwise the
    // parser reported an error message without failing because the
    // helper implementation is unhappy, which has always reported an
    // error.
    mtype = MessageType::FATAL_ERROR;
    if (!res) {
      // This is a real argument parsing error.  Use policy CMP0010 to
      // decide whether it is an error.
      switch (this->GetPolicyStatus(cmPolicies::CMP0010)) {
        case cmPolicies::WARN:
          error << "\n" << cmPolicies::GetPolicyWarning(cmPolicies::CMP0010);
          CM_FALLTHROUGH;
        case cmPolicies::OLD:
          // OLD behavior is to just warn and continue.
          mtype = MessageType::AUTHOR_WARNING;
          break;
        case cmPolicies::REQUIRED_IF_USED:
        case cmPolicies::REQUIRED_ALWAYS:
          error << "\n"
                << cmPolicies::GetRequiredPolicyError(cmPolicies::CMP0010);
          break;
        case cmPolicies::NEW:
          // NEW behavior is to report the error.
          break;
      }
    }
    errorstr = error.str();
  }
  return mtype;
}